

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O2

void __thiscall MockSupport::checkExpectationsOfLastActualCall(MockSupport *this)

{
  MockSupport *node;
  MockSupport *pMVar1;
  MockSupport *pMVar2;
  
  if (this->lastActualFunctionCall_ != (MockCheckedActualCall *)0x0) {
    (*(this->lastActualFunctionCall_->super_MockActualCall)._vptr_MockActualCall[0x31])();
  }
  pMVar2 = (MockSupport *)&this->data_;
  for (node = (MockSupport *)MockNamedValueList::begin((MockNamedValueList *)pMVar2);
      node != (MockSupport *)0x0;
      node = (MockSupport *)MockNamedValueListNode::next((MockNamedValueListNode *)node)) {
    pMVar1 = getMockSupport(pMVar2,(MockNamedValueListNode *)node);
    if (pMVar1 != (MockSupport *)0x0) {
      pMVar1 = getMockSupport(pMVar2,(MockNamedValueListNode *)node);
      if (pMVar1->lastActualFunctionCall_ != (MockCheckedActualCall *)0x0) {
        pMVar2 = getMockSupport(pMVar2,(MockNamedValueListNode *)node);
        (*(pMVar2->lastActualFunctionCall_->super_MockActualCall)._vptr_MockActualCall[0x31])();
      }
    }
    pMVar2 = node;
  }
  return;
}

Assistant:

void MockSupport::checkExpectationsOfLastActualCall()
{
    if(lastActualFunctionCall_)
        lastActualFunctionCall_->checkExpectations();

    for(MockNamedValueListNode *p = data_.begin();p;p = p->next())
        if(getMockSupport(p) && getMockSupport(p)->lastActualFunctionCall_)
            getMockSupport(p)->lastActualFunctionCall_->checkExpectations();
}